

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O3

void __thiscall
spv::Builder::addInstruction
          (Builder *this,unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *inst)

{
  int iVar1;
  uint uVar2;
  Block *pBVar3;
  bool bVar4;
  Id IVar5;
  Instruction *pIVar6;
  _Elt_pointer puVar7;
  _Head_base<0UL,_spv::Instruction_*,_false> _Var8;
  Id IVar9;
  Instruction *raw_instruction_4;
  Instruction *raw_instruction;
  _Head_base<0UL,_spv::Instruction_*,_false> local_50;
  _Head_base<0UL,_spv::Instruction_*,_false> local_48;
  _Head_base<0UL,_spv::Instruction_*,_false> local_40;
  _Head_base<0UL,_spv::Instruction_*,_false> local_38;
  _Head_base<0UL,_spv::Instruction_*,_false> local_30;
  
  pIVar6 = (inst->_M_t).
           super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
           super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
           super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl;
  if (pIVar6->opCode == OpPhi) {
    pBVar3 = this->buildPoint;
    (inst->_M_t).super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>.
    _M_t.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
    super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl = (Instruction *)0x0;
    local_30._M_head_impl = pIVar6;
    std::
    vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
    ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
              ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
                *)&pBVar3->instructions,
               (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_30);
    pIVar6->block = pBVar3;
    _Var8._M_head_impl = local_30._M_head_impl;
    if (pIVar6->resultId != 0) {
      Module::mapInstruction(pBVar3->parent->parent,pIVar6);
      _Var8._M_head_impl = local_30._M_head_impl;
    }
    goto LAB_0045ad93;
  }
  if ((this->emitNonSemanticShaderDebugInfo == true) && (this->dirtyScopeTracker == true)) {
    puVar7 = (this->currentDebugScopeId).c.
             super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
    if (puVar7 == (this->currentDebugScopeId).c.
                  super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_first) {
      puVar7 = (this->currentDebugScopeId).c.
               super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
    }
    bVar4 = Block::updateDebugScope(this->buildPoint,puVar7[-1]);
    if (bVar4) {
      IVar9 = this->uniqueId + 1;
      this->uniqueId = IVar9;
      IVar5 = makeVoidType(this);
      pIVar6 = (Instruction *)operator_new(0x60);
      pIVar6->_vptr_Instruction = (_func_int **)&PTR__Instruction_00afab78;
      pIVar6->resultId = IVar9;
      pIVar6->typeId = IVar5;
      pIVar6->opCode = OpExtInst;
      (pIVar6->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      (pIVar6->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
      (pIVar6->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (pIVar6->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (pIVar6->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (pIVar6->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      (pIVar6->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
      (pIVar6->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
      pIVar6->block = (Block *)0x0;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(&pIVar6->operands,3);
      if ((pIVar6->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_end_of_storage ==
          (pIVar6->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) {
        std::vector<bool,_std::allocator<bool>_>::_M_reallocate(&pIVar6->idOperand,3);
      }
      Instruction::addIdOperand(pIVar6,this->nonSemanticShaderDebugInfo);
      Instruction::addImmediateOperand(pIVar6,0x17);
      puVar7 = (this->currentDebugScopeId).c.
               super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Deque_impl_data._M_finish._M_cur;
      if (puVar7 == (this->currentDebugScopeId).c.
                    super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_first) {
        puVar7 = (this->currentDebugScopeId).c.
                 super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
      }
      Instruction::addIdOperand(pIVar6,puVar7[-1]);
      pBVar3 = this->buildPoint;
      local_40._M_head_impl = pIVar6;
      std::
      vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
      ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
                ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
                  *)&pBVar3->instructions,
                 (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_40);
      pIVar6->block = pBVar3;
      if (pIVar6->resultId != 0) {
        Module::mapInstruction(pBVar3->parent->parent,pIVar6);
      }
      if (local_40._M_head_impl != (Instruction *)0x0) {
        (*(local_40._M_head_impl)->_vptr_Instruction[1])();
      }
      local_40._M_head_impl = (Instruction *)0x0;
    }
    this->dirtyScopeTracker = false;
  }
  if ((this->trackDebugInfo == true) && (this->dirtyLineTracker == true)) {
    pBVar3 = this->buildPoint;
    iVar1 = this->currentLine;
    IVar5 = this->currentFileId;
    if ((pBVar3->currentSourceLoc).super__Optional_base<spv::DebugSourceLocation,_true,_true>.
        _M_payload.super__Optional_payload_base<spv::DebugSourceLocation>._M_engaged == true) {
      if ((((pBVar3->currentSourceLoc).super__Optional_base<spv::DebugSourceLocation,_true,_true>.
            _M_payload.super__Optional_payload_base<spv::DebugSourceLocation>._M_payload._M_value.
            line != iVar1) ||
          ((pBVar3->currentSourceLoc).super__Optional_base<spv::DebugSourceLocation,_true,_true>.
           _M_payload.super__Optional_payload_base<spv::DebugSourceLocation>._M_payload._M_value.
           column != 0)) ||
         ((pBVar3->currentSourceLoc).super__Optional_base<spv::DebugSourceLocation,_true,_true>.
          _M_payload.super__Optional_payload_base<spv::DebugSourceLocation>._M_payload._M_value.
          fileId != IVar5)) {
        (pBVar3->currentSourceLoc).super__Optional_base<spv::DebugSourceLocation,_true,_true>.
        _M_payload.super__Optional_payload_base<spv::DebugSourceLocation>._M_payload._M_value.line =
             iVar1;
        (pBVar3->currentSourceLoc).super__Optional_base<spv::DebugSourceLocation,_true,_true>.
        _M_payload.super__Optional_payload_base<spv::DebugSourceLocation>._M_payload._M_value.column
             = 0;
        (pBVar3->currentSourceLoc).super__Optional_base<spv::DebugSourceLocation,_true,_true>.
        _M_payload.super__Optional_payload_base<spv::DebugSourceLocation>._M_payload._M_value.fileId
             = IVar5;
        goto LAB_0045aa92;
      }
    }
    else {
      (pBVar3->currentSourceLoc).super__Optional_base<spv::DebugSourceLocation,_true,_true>.
      _M_payload.super__Optional_payload_base<spv::DebugSourceLocation>._M_payload._M_value.line =
           iVar1;
      (pBVar3->currentSourceLoc).super__Optional_base<spv::DebugSourceLocation,_true,_true>.
      _M_payload.super__Optional_payload_base<spv::DebugSourceLocation>._M_payload._M_value.column =
           0;
      (pBVar3->currentSourceLoc).super__Optional_base<spv::DebugSourceLocation,_true,_true>.
      _M_payload.super__Optional_payload_base<spv::DebugSourceLocation>._M_payload._M_value.fileId =
           IVar5;
      (pBVar3->currentSourceLoc).super__Optional_base<spv::DebugSourceLocation,_true,_true>.
      _M_payload.super__Optional_payload_base<spv::DebugSourceLocation>._M_engaged = true;
LAB_0045aa92:
      if (this->emitSpirvDebugInfo == true) {
        pIVar6 = (Instruction *)operator_new(0x60);
        pIVar6->_vptr_Instruction = (_func_int **)&PTR__Instruction_00afab78;
        pIVar6->resultId = 0;
        pIVar6->typeId = 0;
        pIVar6->opCode = OpLine;
        (pIVar6->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        (pIVar6->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
        (pIVar6->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (pIVar6->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (pIVar6->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (pIVar6->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        (pIVar6->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
        (pIVar6->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
        pIVar6->block = (Block *)0x0;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(&pIVar6->operands,3);
        if ((pIVar6->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_end_of_storage ==
            (pIVar6->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) {
          std::vector<bool,_std::allocator<bool>_>::_M_reallocate(&pIVar6->idOperand,3);
        }
        Instruction::addIdOperand(pIVar6,this->currentFileId);
        Instruction::addImmediateOperand(pIVar6,this->currentLine);
        Instruction::addImmediateOperand(pIVar6,0);
        pBVar3 = this->buildPoint;
        local_48._M_head_impl = pIVar6;
        std::
        vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
        ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
                  ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
                    *)&pBVar3->instructions,
                   (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_48
                  );
        pIVar6->block = pBVar3;
        if (pIVar6->resultId != 0) {
          Module::mapInstruction(pBVar3->parent->parent,pIVar6);
        }
        if (local_48._M_head_impl != (Instruction *)0x0) {
          (*(local_48._M_head_impl)->_vptr_Instruction[1])();
        }
        local_48._M_head_impl = (Instruction *)0x0;
      }
      if (this->emitNonSemanticShaderDebugInfo == true) {
        IVar9 = this->uniqueId + 1;
        this->uniqueId = IVar9;
        IVar5 = makeVoidType(this);
        pIVar6 = (Instruction *)operator_new(0x60);
        pIVar6->_vptr_Instruction = (_func_int **)&PTR__Instruction_00afab78;
        pIVar6->resultId = IVar9;
        pIVar6->typeId = IVar5;
        pIVar6->opCode = OpExtInst;
        (pIVar6->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        (pIVar6->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
        (pIVar6->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (pIVar6->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (pIVar6->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (pIVar6->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        (pIVar6->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
        (pIVar6->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
        pIVar6->block = (Block *)0x0;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(&pIVar6->operands,7);
        if ((pIVar6->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_end_of_storage ==
            (pIVar6->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) {
          std::vector<bool,_std::allocator<bool>_>::_M_reallocate(&pIVar6->idOperand,7);
        }
        Instruction::addIdOperand(pIVar6,this->nonSemanticShaderDebugInfo);
        Instruction::addImmediateOperand(pIVar6,0x67);
        IVar5 = makeDebugSource(this,this->currentFileId);
        Instruction::addIdOperand(pIVar6,IVar5);
        uVar2 = this->currentLine;
        IVar5 = makeIntegerType(this,0x20,false);
        IVar5 = makeIntConstant(this,IVar5,uVar2,false);
        Instruction::addIdOperand(pIVar6,IVar5);
        uVar2 = this->currentLine;
        IVar5 = makeIntegerType(this,0x20,false);
        IVar5 = makeIntConstant(this,IVar5,uVar2,false);
        Instruction::addIdOperand(pIVar6,IVar5);
        IVar5 = makeIntegerType(this,0x20,false);
        IVar5 = makeIntConstant(this,IVar5,0,false);
        Instruction::addIdOperand(pIVar6,IVar5);
        IVar5 = makeIntegerType(this,0x20,false);
        IVar5 = makeIntConstant(this,IVar5,0,false);
        Instruction::addIdOperand(pIVar6,IVar5);
        pBVar3 = this->buildPoint;
        local_50._M_head_impl = pIVar6;
        std::
        vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
        ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
                  ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
                    *)&pBVar3->instructions,
                   (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_50
                  );
        pIVar6->block = pBVar3;
        if (pIVar6->resultId != 0) {
          Module::mapInstruction(pBVar3->parent->parent,pIVar6);
        }
        if (local_50._M_head_impl != (Instruction *)0x0) {
          (*(local_50._M_head_impl)->_vptr_Instruction[1])();
        }
        local_50._M_head_impl = (Instruction *)0x0;
      }
    }
    this->dirtyLineTracker = false;
  }
  pBVar3 = this->buildPoint;
  pIVar6 = (inst->_M_t).
           super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
           super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
           super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl;
  (inst->_M_t).super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
  super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
  super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl = (Instruction *)0x0;
  local_38._M_head_impl = pIVar6;
  std::
  vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
  ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
            ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
              *)&pBVar3->instructions,
             (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_38);
  pIVar6->block = pBVar3;
  _Var8._M_head_impl = local_38._M_head_impl;
  if (pIVar6->resultId != 0) {
    Module::mapInstruction(pBVar3->parent->parent,pIVar6);
    _Var8._M_head_impl = local_38._M_head_impl;
  }
LAB_0045ad93:
  if (_Var8._M_head_impl != (Instruction *)0x0) {
    (*(_Var8._M_head_impl)->_vptr_Instruction[1])();
  }
  return;
}

Assistant:

void Builder::addInstruction(std::unique_ptr<Instruction> inst) {
    // Phis must appear first in their block, don't insert line tracking instructions
    // in front of them, just add the OpPhi and return.
    if (inst->getOpCode() == OpPhi) {
        buildPoint->addInstruction(std::move(inst));
        return;
    }
    // Optionally insert OpDebugScope
    if (emitNonSemanticShaderDebugInfo && dirtyScopeTracker) {
        if (buildPoint->updateDebugScope(currentDebugScopeId.top())) {
            auto scopeInst = std::make_unique<Instruction>(getUniqueId(), makeVoidType(), OpExtInst);
            scopeInst->reserveOperands(3);
            scopeInst->addIdOperand(nonSemanticShaderDebugInfo);
            scopeInst->addImmediateOperand(NonSemanticShaderDebugInfo100DebugScope);
            scopeInst->addIdOperand(currentDebugScopeId.top());
            buildPoint->addInstruction(std::move(scopeInst));
        }

        dirtyScopeTracker = false;
    }

    // Insert OpLine/OpDebugLine if the debug source location has changed
    if (trackDebugInfo && dirtyLineTracker) {
        if (buildPoint->updateDebugSourceLocation(currentLine, 0, currentFileId)) {
            if (emitSpirvDebugInfo) {
                auto lineInst = std::make_unique<Instruction>(OpLine);
                lineInst->reserveOperands(3);
                lineInst->addIdOperand(currentFileId);
                lineInst->addImmediateOperand(currentLine);
                lineInst->addImmediateOperand(0);
                buildPoint->addInstruction(std::move(lineInst));
            }
            if (emitNonSemanticShaderDebugInfo) {
                auto lineInst = std::make_unique<Instruction>(getUniqueId(), makeVoidType(), OpExtInst);
                lineInst->reserveOperands(7);
                lineInst->addIdOperand(nonSemanticShaderDebugInfo);
                lineInst->addImmediateOperand(NonSemanticShaderDebugInfo100DebugLine);
                lineInst->addIdOperand(makeDebugSource(currentFileId));
                lineInst->addIdOperand(makeUintConstant(currentLine));
                lineInst->addIdOperand(makeUintConstant(currentLine));
                lineInst->addIdOperand(makeUintConstant(0));
                lineInst->addIdOperand(makeUintConstant(0));
                buildPoint->addInstruction(std::move(lineInst));
            }
        }

        dirtyLineTracker = false;
    }

    buildPoint->addInstruction(std::move(inst));
}